

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuArch.c
# Opt level: O0

int x86cpuid_GetFirm(Cx86cpuid *p)

{
  ulong uVar1;
  UInt32 *v;
  uint i;
  Cx86cpuid *p_local;
  
  i = 0;
  while( true ) {
    if (2 < i) {
      return -1;
    }
    uVar1 = (ulong)i;
    if (((kVendors[uVar1][0] == p->vendor[0]) && (kVendors[uVar1][1] == p->vendor[1])) &&
       (kVendors[uVar1][2] == p->vendor[2])) break;
    i = i + 1;
  }
  return i;
}

Assistant:

int x86cpuid_GetFirm(const Cx86cpuid *p)
{
  unsigned i;
  for (i = 0; i < sizeof(kVendors) / sizeof(kVendors[i]); i++)
  {
    const UInt32 *v = kVendors[i];
    if (v[0] == p->vendor[0] &&
        v[1] == p->vendor[1] &&
        v[2] == p->vendor[2])
      return (int)i;
  }
  return -1;
}